

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isMemberQualifier(TokenKind kind)

{
  uint uVar1;
  undefined2 in_register_0000003a;
  
  if (CONCAT22(in_register_0000003a,kind) < 0xd1) {
    if ((CONCAT22(in_register_0000003a,kind) != 0x7d) &&
       (CONCAT22(in_register_0000003a,kind) != 0xa7)) {
      return false;
    }
  }
  else {
    uVar1 = CONCAT22(in_register_0000003a,kind) - 0xd1;
    if ((((0x29 < uVar1) || ((0x38100000001U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
        (CONCAT22(in_register_0000003a,kind) != 0x11c)) &&
       (CONCAT22(in_register_0000003a,kind) != 0x145)) {
      return false;
    }
  }
  return true;
}

Assistant:

bool SyntaxFacts::isMemberQualifier(TokenKind kind) {
    switch (kind) {
        case TokenKind::ConstKeyword:
        case TokenKind::RandKeyword:
        case TokenKind::RandCKeyword:
        case TokenKind::PureKeyword:
        case TokenKind::VirtualKeyword:
        case TokenKind::ExternKeyword:
        case TokenKind::StaticKeyword:
        case TokenKind::LocalKeyword:
        case TokenKind::ProtectedKeyword:
            return true;
        default:
            return false;
    }
}